

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws_server.cpp
# Opt level: O3

string * __thiscall
pstore::http::ws_error_category::message_abi_cxx11_
          (string *__return_storage_ptr__,ws_error_category *this,int error)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch(error) {
  case 1:
    pcVar2 = "One of a client frame\'s reserved bits was unexpectedly set";
    pcVar1 = "";
    break;
  case 2:
    pcVar2 = "The frame\'s payload length was too large";
    pcVar1 = "";
    break;
  case 3:
    pcVar2 = "The client sent an unmasked frame";
    pcVar1 = "";
    break;
  case 4:
    pcVar2 = "Message too long";
    pcVar1 = "";
    break;
  case 5:
    pcVar2 = "Insufficient data was received";
    pcVar1 = "";
    break;
  default:
    pcVar2 = "Unknown error";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

auto ws_error_category::message (int const error) const -> std::string {
            switch (static_cast<ws_error> (error)) {
            case ws_error::reserved_bit_set:
                return "One of a client frame's reserved bits was unexpectedly set";
            case ws_error::payload_too_long: return "The frame's payload length was too large";
            case ws_error::unmasked_frame: return "The client sent an unmasked frame";
            case ws_error::message_too_long: return "Message too long";
            case ws_error::insufficient_data: return "Insufficient data was received";
            }
            return "Unknown error";
        }